

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

string * __thiscall
IfNeuron::getParameter(string *__return_storage_ptr__,IfNeuron *this,string *name)

{
  bool bVar1;
  long lVar2;
  string *this_00;
  stringstream param;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::operator==(name,"threshold");
  lVar2 = 0x300;
  if (bVar1) {
LAB_00132b9f:
    std::ostream::_M_insert<double>
              (*(double *)((long)&(this->super_SpikingNeuron).super_Neuron._vptr_Neuron + lVar2));
  }
  else {
    bVar1 = std::operator==(name,"spike-height");
    lVar2 = 0x2f8;
    if (bVar1) goto LAB_00132b9f;
    bVar1 = std::operator==(name,"membrane starting-value");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"starting-value",&local_1e1);
      DifferentialEquation::getParameter(&local_1e0,&this->ifneuronMembrane,&local_1c0);
      std::operator<<(&local_190,(string *)&local_1e0);
LAB_00132c05:
      std::__cxx11::string::~string((string *)&local_1e0);
      this_00 = &local_1c0;
    }
    else {
      bVar1 = std::operator==(name,"membrane");
      if (!bVar1) {
        bVar1 = std::operator==(name,"membrane integration-mode");
        if (!bVar1) {
          Parametric::getParameter
                    (__return_storage_ptr__,
                     (Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,name)
          ;
          goto LAB_00132c63;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"mode",&local_1e1);
        DifferentialEquation::getParameter(&local_1e0,&this->ifneuronMembrane,&local_1c0);
        std::operator<<(&local_190,(string *)&local_1e0);
        goto LAB_00132c05;
      }
      Parametric::getConfiguration_abi_cxx11_(&local_1e0,(Parametric *)&this->ifneuronMembrane);
      std::operator<<(&local_190,(string *)&local_1e0);
      this_00 = &local_1e0;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__cxx11::stringbuf::str();
LAB_00132c63:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string IfNeuron::getParameter(const string& name) const
{
	stringstream param;
	if (name == "threshold")
		param << ifneuronTheta;
	else if (name=="spike-height")
		param << ifneuronSpikeHeight;
	else if (name== "membrane starting-value")
		param << ifneuronMembrane.getParameter("starting-value");
	else if (name=="membrane")
		param << ifneuronMembrane.getConfiguration();
	else if (name=="membrane integration-mode")
		param << ifneuronMembrane.getParameter("mode");
	else
		return SpikingNeuron::getParameter(name);
		
	return param.str();
}